

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNodeGetSpacePreserve(void)

{
  int iVar1;
  int iVar2;
  uint local_24;
  int n_cur;
  xmlNode *cur;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (local_24 = 0; (int)local_24 < 1; local_24 = local_24 + 1) {
    iVar1 = xmlMemBlocks();
    iVar2 = xmlNodeGetSpacePreserve(0);
    desret_int(iVar2);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNodeGetSpacePreserve",(ulong)(uint)(iVar2 - iVar1));
      ret_val = ret_val + 1;
      printf(" %d",(ulong)local_24);
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlNodeGetSpacePreserve(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlNode * cur; /* the node being checked */
    int n_cur;

    for (n_cur = 0;n_cur < gen_nb_const_xmlNode_ptr;n_cur++) {
        mem_base = xmlMemBlocks();
        cur = gen_const_xmlNode_ptr(n_cur, 0);

        ret_val = xmlNodeGetSpacePreserve((const xmlNode *)cur);
        desret_int(ret_val);
        call_tests++;
        des_const_xmlNode_ptr(n_cur, (const xmlNode *)cur, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNodeGetSpacePreserve",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_cur);
            printf("\n");
        }
    }
    function_tests++;

    return(test_ret);
}